

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaTypePtr
xmlSchemaParseComplexType
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int topLevel)

{
  xmlSchemaPtr ctxt_00;
  int iVar1;
  xmlAttrPtr attr_00;
  xmlSchemaTypePtr pxVar2;
  xmlSchemaAnnotPtr pxVar3;
  xmlSchemaWildcardPtr pxVar4;
  int local_6c;
  int local_68;
  int hasRestrictionOrExtension;
  int block;
  int final;
  xmlChar *attrValue;
  xmlAttrPtr attr;
  xmlChar *name;
  xmlNodePtr child;
  xmlSchemaTypePtr ctxtType;
  xmlSchemaTypePtr type;
  xmlNodePtr pxStack_28;
  int topLevel_local;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  name = (xmlChar *)0x0;
  attr = (xmlAttrPtr)0x0;
  hasRestrictionOrExtension = 0;
  local_68 = 0;
  local_6c = 0;
  if (((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    return (xmlSchemaTypePtr)0x0;
  }
  child = (xmlNodePtr)ctxt->ctxtType;
  type._4_4_ = topLevel;
  pxStack_28 = node;
  node_local = (xmlNodePtr)schema;
  schema_local = (xmlSchemaPtr)ctxt;
  if (topLevel != 0) {
    attr_00 = xmlSchemaGetPropNode(node,"name");
    ctxt_00 = schema_local;
    attrValue = (xmlChar *)attr_00;
    if (attr_00 == (xmlAttrPtr)0x0) {
      xmlSchemaPMissingAttrErr
                ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_MISSING,
                 (xmlSchemaBasicItemPtr)0x0,pxStack_28,"name",(char *)0x0);
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar2 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
    iVar1 = xmlSchemaPValAttrNode
                      ((xmlSchemaParserCtxtPtr)ctxt_00,(xmlSchemaBasicItemPtr)0x0,attr_00,pxVar2,
                       (xmlChar **)&attr);
    if (iVar1 != 0) {
      return (xmlSchemaTypePtr)0x0;
    }
  }
  if (type._4_4_ == 0) {
    ctxtType = xmlSchemaAddType((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                XML_SCHEMA_TYPE_COMPLEX,(xmlChar *)0x0,
                                (xmlChar *)schema_local[1].annot,pxStack_28,0);
    if (ctxtType == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    attr = (xmlAttrPtr)ctxtType->name;
    ctxtType->node = pxStack_28;
    ctxtType->type = XML_SCHEMA_TYPE_COMPLEX;
  }
  else {
    ctxtType = xmlSchemaAddType((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                XML_SCHEMA_TYPE_COMPLEX,(xmlChar *)attr,
                                (xmlChar *)schema_local[1].annot,pxStack_28,1);
    if (ctxtType == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    ctxtType->node = pxStack_28;
    ctxtType->type = XML_SCHEMA_TYPE_COMPLEX;
    ctxtType->flags = ctxtType->flags | 8;
  }
  ctxtType->targetNamespace = (xmlChar *)schema_local[1].annot;
  for (attrValue = (xmlChar *)pxStack_28->properties; attrValue != (xmlChar *)0x0;
      attrValue = *(xmlChar **)(attrValue + 0x30)) {
    if (*(long *)(attrValue + 0x48) == 0) {
      iVar1 = xmlStrEqual(*(xmlChar **)(attrValue + 0x10),"id");
      if (iVar1 == 0) {
        iVar1 = xmlStrEqual(*(xmlChar **)(attrValue + 0x10),(xmlChar *)"mixed");
        if (iVar1 == 0) {
          if (type._4_4_ == 0) {
            xmlSchemaPIllegalAttrErr
                      ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                       (xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)attrValue);
          }
          else {
            iVar1 = xmlStrEqual(*(xmlChar **)(attrValue + 0x10),"name");
            if (iVar1 == 0) {
              iVar1 = xmlStrEqual(*(xmlChar **)(attrValue + 0x10),"abstract");
              if (iVar1 == 0) {
                iVar1 = xmlStrEqual(*(xmlChar **)(attrValue + 0x10),(xmlChar *)"final");
                if (iVar1 == 0) {
                  iVar1 = xmlStrEqual(*(xmlChar **)(attrValue + 0x10),(xmlChar *)"block");
                  if (iVar1 == 0) {
                    xmlSchemaPIllegalAttrErr
                              ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED
                               ,(xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)attrValue);
                  }
                  else {
                    _block = xmlSchemaGetNodeContent
                                       ((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)attrValue);
                    iVar1 = xmlSchemaPValAttrBlockFinal
                                      (_block,&ctxtType->flags,-1,0x40000,0x80000,-1,-1,-1);
                    if (iVar1 == 0) {
                      local_68 = 1;
                    }
                    else {
                      xmlSchemaPSimpleTypeErr
                                ((xmlSchemaParserCtxtPtr)schema_local,
                                 XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)0x0,
                                 (xmlNodePtr)attrValue,(xmlSchemaTypePtr)0x0,
                                 "(#all | List of (extension | restriction)) ",_block,(char *)0x0,
                                 (xmlChar *)0x0,(xmlChar *)0x0);
                    }
                  }
                }
                else {
                  _block = xmlSchemaGetNodeContent
                                     ((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)attrValue);
                  iVar1 = xmlSchemaPValAttrBlockFinal
                                    (_block,&ctxtType->flags,-1,0x200,0x400,-1,-1,-1);
                  if (iVar1 == 0) {
                    hasRestrictionOrExtension = 1;
                  }
                  else {
                    xmlSchemaPSimpleTypeErr
                              ((xmlSchemaParserCtxtPtr)schema_local,
                               XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)0x0,
                               (xmlNodePtr)attrValue,(xmlSchemaTypePtr)0x0,
                               "(#all | List of (extension | restriction))",_block,(char *)0x0,
                               (xmlChar *)0x0,(xmlChar *)0x0);
                  }
                }
              }
              else {
                iVar1 = xmlSchemaPGetBoolNodeValue
                                  ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaBasicItemPtr)0x0,
                                   (xmlNodePtr)attrValue);
                if (iVar1 != 0) {
                  ctxtType->flags = ctxtType->flags | 0x100000;
                }
              }
            }
          }
        }
        else {
          iVar1 = xmlSchemaPGetBoolNodeValue
                            ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaBasicItemPtr)0x0,
                             (xmlNodePtr)attrValue);
          if (iVar1 != 0) {
            ctxtType->flags = ctxtType->flags | 1;
          }
        }
      }
      else {
        xmlSchemaPValAttrID((xmlSchemaParserCtxtPtr)schema_local,pxStack_28,"id");
      }
    }
    else {
      iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(attrValue + 0x48) + 0x10),xmlSchemaNs);
      if (iVar1 != 0) {
        xmlSchemaPIllegalAttrErr
                  ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                   (xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)attrValue);
      }
    }
  }
  if (local_68 == 0) {
    if (((ulong)node_local->next & 0x80) != 0) {
      ctxtType->flags = ctxtType->flags | 0x80000;
    }
    if (((ulong)node_local->next & 0x40) != 0) {
      ctxtType->flags = ctxtType->flags | 0x40000;
    }
  }
  if (hasRestrictionOrExtension == 0) {
    if (((ulong)node_local->next & 8) != 0) {
      ctxtType->flags = ctxtType->flags | 0x400;
    }
    if (((ulong)node_local->next & 4) != 0) {
      ctxtType->flags = ctxtType->flags | 0x200;
    }
  }
  name = (xmlChar *)pxStack_28->children;
  if ((((_xmlNode *)name != (_xmlNode *)0x0) && (((_xmlNode *)name)->ns != (xmlNs *)0x0)) &&
     ((iVar1 = xmlStrEqual(((_xmlNode *)name)->name,(xmlChar *)"annotation"), iVar1 != 0 &&
      (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x48) + 0x10),xmlSchemaNs), iVar1 != 0))))
  {
    pxVar3 = xmlSchemaParseAnnotation((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)name,1);
    ctxtType->annot = pxVar3;
    name = *(xmlChar **)(name + 0x30);
  }
  schema_local[1].name = (xmlChar *)ctxtType;
  if (((name == (xmlChar *)0x0) || (*(long *)(name + 0x48) == 0)) ||
     ((iVar1 = xmlStrEqual(*(xmlChar **)(name + 0x10),(xmlChar *)"simpleContent"), iVar1 == 0 ||
      (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x48) + 0x10),xmlSchemaNs), iVar1 == 0))))
  {
    if ((((name == (xmlChar *)0x0) || (*(long *)(name + 0x48) == 0)) ||
        (iVar1 = xmlStrEqual(*(xmlChar **)(name + 0x10),(xmlChar *)"complexContent"), iVar1 == 0))
       || (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x48) + 0x10),xmlSchemaNs), iVar1 == 0
          )) {
      pxVar2 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
      ctxtType->baseType = pxVar2;
      ctxtType->flags = ctxtType->flags | 4;
      if (((name == (xmlChar *)0x0) || (*(long *)(name + 0x48) == 0)) ||
         ((iVar1 = xmlStrEqual(*(xmlChar **)(name + 0x10),"all"), iVar1 == 0 ||
          (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x48) + 0x10),xmlSchemaNs), iVar1 == 0
          )))) {
        if (((name == (xmlChar *)0x0) || (*(long *)(name + 0x48) == 0)) ||
           ((iVar1 = xmlStrEqual(*(xmlChar **)(name + 0x10),(xmlChar *)"choice"), iVar1 == 0 ||
            (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x48) + 0x10),xmlSchemaNs),
            iVar1 == 0)))) {
          if ((((name == (xmlChar *)0x0) || (*(long *)(name + 0x48) == 0)) ||
              (iVar1 = xmlStrEqual(*(xmlChar **)(name + 0x10),(xmlChar *)"sequence"), iVar1 == 0))
             || (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x48) + 0x10),xmlSchemaNs),
                iVar1 == 0)) {
            if (((name != (xmlChar *)0x0) && (*(long *)(name + 0x48) != 0)) &&
               ((iVar1 = xmlStrEqual(*(xmlChar **)(name + 0x10),"group"), iVar1 != 0 &&
                (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x48) + 0x10),xmlSchemaNs),
                iVar1 != 0)))) {
              pxVar2 = (xmlSchemaTypePtr)
                       xmlSchemaParseModelGroupDefRef
                                 ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                  (xmlNodePtr)name);
              ctxtType->subtypes = pxVar2;
              name = *(xmlChar **)(name + 0x30);
            }
          }
          else {
            pxVar2 = (xmlSchemaTypePtr)
                     xmlSchemaParseModelGroup
                               ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                (xmlNodePtr)name,XML_SCHEMA_TYPE_SEQUENCE,1);
            ctxtType->subtypes = pxVar2;
            name = *(xmlChar **)(name + 0x30);
          }
        }
        else {
          pxVar2 = (xmlSchemaTypePtr)
                   xmlSchemaParseModelGroup
                             ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                              (xmlNodePtr)name,XML_SCHEMA_TYPE_CHOICE,1);
          ctxtType->subtypes = pxVar2;
          name = *(xmlChar **)(name + 0x30);
        }
      }
      else {
        pxVar2 = (xmlSchemaTypePtr)
                 xmlSchemaParseModelGroup
                           ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                            (xmlNodePtr)name,XML_SCHEMA_TYPE_ALL,1);
        ctxtType->subtypes = pxVar2;
        name = *(xmlChar **)(name + 0x30);
      }
      iVar1 = xmlSchemaParseLocalAttributes
                        ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                         (xmlNodePtr *)&name,(xmlSchemaItemListPtr *)&ctxtType->attrUses,0xc,
                         (int *)0x0);
      if (iVar1 == -1) {
        return (xmlSchemaTypePtr)0x0;
      }
      if (((name != (xmlChar *)0x0) && (*(long *)(name + 0x48) != 0)) &&
         ((iVar1 = xmlStrEqual(*(xmlChar **)(name + 0x10),(xmlChar *)"anyAttribute"), iVar1 != 0 &&
          (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x48) + 0x10),xmlSchemaNs), iVar1 != 0
          )))) {
        pxVar4 = xmlSchemaParseAnyAttribute
                           ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                            (xmlNodePtr)name);
        ctxtType->attributeWildcard = pxVar4;
        name = *(xmlChar **)(name + 0x30);
      }
    }
    else {
      ctxtType->contentType = XML_SCHEMA_CONTENT_EMPTY;
      xmlSchemaParseComplexContent
                ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,(xmlNodePtr)name,
                 &local_6c);
      name = *(xmlChar **)(name + 0x30);
    }
  }
  else {
    if ((ctxtType->flags & 1U) != 0) {
      ctxtType->flags = ctxtType->flags ^ 1;
    }
    xmlSchemaParseSimpleContent
              ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,(xmlNodePtr)name,
               &local_6c);
    name = *(xmlChar **)(name + 0x30);
  }
  if (name != (xmlChar *)0x0) {
    xmlSchemaPContentErr
              ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
               (xmlSchemaBasicItemPtr)0x0,pxStack_28,(xmlNodePtr)name,(char *)0x0,
               "(annotation?, (simpleContent | complexContent | ((group | all | choice | sequence)?, ((attribute | attributeGroup)*, anyAttribute?))))"
              );
  }
  if (((type._4_4_ != 0) && (*(int *)((long)&schema_local[1].id + 4) != 0)) && (local_6c == 0)) {
    xmlSchemaPCustomErr((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_SRC_REDEFINE,
                        (xmlSchemaBasicItemPtr)0x0,pxStack_28,
                        "This is a redefinition, thus the <complexType> must have a <restriction> or <extension> grand-child"
                        ,(xmlChar *)0x0);
  }
  schema_local[1].name = (xmlChar *)child;
  return ctxtType;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaParseComplexType(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                          xmlNodePtr node, int topLevel)
{
    xmlSchemaTypePtr type, ctxtType;
    xmlNodePtr child = NULL;
    const xmlChar *name = NULL;
    xmlAttrPtr attr;
    const xmlChar *attrValue;
#ifdef ENABLE_NAMED_LOCALS
    char buf[40];
#endif
    int final = 0, block = 0, hasRestrictionOrExtension = 0;


    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    ctxtType = ctxt->ctxtType;

    if (topLevel) {
	attr = xmlSchemaGetPropNode(node, "name");
	if (attr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING, NULL, node, "name", NULL);
	    return (NULL);
	} else if (xmlSchemaPValAttrNode(ctxt, NULL, attr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0) {
	    return (NULL);
	}
    }

    if (topLevel == 0) {
	/*
	* Parse as local complex type definition.
	*/
#ifdef ENABLE_NAMED_LOCALS
        snprintf(buf, 39, "#CT%d", ctxt->counter++ + 1);
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_COMPLEX,
	    xmlDictLookup(ctxt->dict, (const xmlChar *)buf, -1),
	    ctxt->targetNamespace, node, 0);
#else
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_COMPLEX,
	    NULL, ctxt->targetNamespace, node, 0);
#endif
	if (type == NULL)
	    return (NULL);
	name = type->name;
	type->node = node;
	type->type = XML_SCHEMA_TYPE_COMPLEX;
	/*
	* TODO: We need the target namespace.
	*/
    } else {
	/*
	* Parse as global complex type definition.
	*/
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_COMPLEX,
	    name, ctxt->targetNamespace, node, 1);
	if (type == NULL)
	    return (NULL);
	type->node = node;
	type->type = XML_SCHEMA_TYPE_COMPLEX;
	type->flags |= XML_SCHEMAS_TYPE_GLOBAL;
    }
    type->targetNamespace = ctxt->targetNamespace;
    /*
    * Handle attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if (xmlStrEqual(attr->name, BAD_CAST "id")) {
		/*
		* Attribute "id".
		*/
		xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
	    } else if (xmlStrEqual(attr->name, BAD_CAST "mixed")) {
		/*
		* Attribute "mixed".
		*/
		if (xmlSchemaPGetBoolNodeValue(ctxt,
			NULL, (xmlNodePtr) attr))
		    type->flags |= XML_SCHEMAS_TYPE_MIXED;
	    } else if (topLevel) {
		/*
		* Attributes of global complex type definitions.
		*/
		if (xmlStrEqual(attr->name, BAD_CAST "name")) {
		    /* Pass. */
		} else if (xmlStrEqual(attr->name, BAD_CAST "abstract")) {
		    /*
		    * Attribute "abstract".
		    */
		    if (xmlSchemaPGetBoolNodeValue(ctxt,
			    NULL, (xmlNodePtr) attr))
			type->flags |= XML_SCHEMAS_TYPE_ABSTRACT;
		} else if (xmlStrEqual(attr->name, BAD_CAST "final")) {
		    /*
		    * Attribute "final".
		    */
		    attrValue = xmlSchemaGetNodeContent(ctxt,
			(xmlNodePtr) attr);
		    if (xmlSchemaPValAttrBlockFinal(attrValue,
			&(type->flags),
			-1,
			XML_SCHEMAS_TYPE_FINAL_EXTENSION,
			XML_SCHEMAS_TYPE_FINAL_RESTRICTION,
			-1, -1, -1) != 0)
		    {
			xmlSchemaPSimpleTypeErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			    NULL, (xmlNodePtr) attr, NULL,
			    "(#all | List of (extension | restriction))",
			    attrValue, NULL, NULL, NULL);
		    } else
			final = 1;
		} else if (xmlStrEqual(attr->name, BAD_CAST "block")) {
		    /*
		    * Attribute "block".
		    */
		    attrValue = xmlSchemaGetNodeContent(ctxt,
			(xmlNodePtr) attr);
		    if (xmlSchemaPValAttrBlockFinal(attrValue, &(type->flags),
			-1,
			XML_SCHEMAS_TYPE_BLOCK_EXTENSION,
			XML_SCHEMAS_TYPE_BLOCK_RESTRICTION,
			-1, -1, -1) != 0) {
			xmlSchemaPSimpleTypeErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			    NULL, (xmlNodePtr) attr, NULL,
			    "(#all | List of (extension | restriction)) ",
			    attrValue, NULL, NULL, NULL);
		    } else
			block = 1;
		} else {
			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    if (! block) {
	/*
	* Apply default "block" values.
	*/
	if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_RESTRICTION)
	    type->flags |= XML_SCHEMAS_TYPE_BLOCK_RESTRICTION;
	if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_EXTENSION)
	    type->flags |= XML_SCHEMAS_TYPE_BLOCK_EXTENSION;
    }
    if (! final) {
	/*
	* Apply default "block" values.
	*/
	if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
	    type->flags |= XML_SCHEMAS_TYPE_FINAL_RESTRICTION;
	if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_EXTENSION)
	    type->flags |= XML_SCHEMAS_TYPE_FINAL_EXTENSION;
    }
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        type->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    ctxt->ctxtType = type;
    if (IS_SCHEMA(child, "simpleContent")) {
	/*
	* <complexType><simpleContent>...
	* 3.4.3 : 2.2
	* Specifying mixed='true' when the <simpleContent>
	* alternative is chosen has no effect
	*/
	if (type->flags & XML_SCHEMAS_TYPE_MIXED)
	    type->flags ^= XML_SCHEMAS_TYPE_MIXED;
        xmlSchemaParseSimpleContent(ctxt, schema, child,
	    &hasRestrictionOrExtension);
        child = child->next;
    } else if (IS_SCHEMA(child, "complexContent")) {
	/*
	* <complexType><complexContent>...
	*/
	type->contentType = XML_SCHEMA_CONTENT_EMPTY;
        xmlSchemaParseComplexContent(ctxt, schema, child,
	    &hasRestrictionOrExtension);
        child = child->next;
    } else {
	/*
	* E.g <complexType><sequence>... or <complexType><attribute>... etc.
	*
	* SPEC
	* "...the third alternative (neither <simpleContent> nor
	* <complexContent>) is chosen. This case is understood as shorthand
	* for complex content restricting the `ur-type definition`, and the
	* details of the mappings should be modified as necessary.
	*/
	type->baseType = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
	type->flags |= XML_SCHEMAS_TYPE_DERIVATION_METHOD_RESTRICTION;
	/*
	* Parse model groups.
	*/
        if (IS_SCHEMA(child, "all")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_ALL, 1);
            child = child->next;
        } else if (IS_SCHEMA(child, "choice")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_CHOICE, 1);
            child = child->next;
        } else if (IS_SCHEMA(child, "sequence")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_SEQUENCE, 1);
            child = child->next;
        } else if (IS_SCHEMA(child, "group")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroupDefRef(ctxt, schema, child);
	    /*
	    * Note that the reference will be resolved in
	    * xmlSchemaResolveTypeReferences();
	    */
            child = child->next;
        }
	/*
	* Parse attribute decls/refs.
	*/
        if (xmlSchemaParseLocalAttributes(ctxt, schema, &child,
	    (xmlSchemaItemListPtr *) &(type->attrUses),
	    XML_SCHEMA_TYPE_RESTRICTION, NULL) == -1)
	    return(NULL);
	/*
	* Parse attribute wildcard.
	*/
	if (IS_SCHEMA(child, "anyAttribute")) {
	    type->attributeWildcard = xmlSchemaParseAnyAttribute(ctxt, schema, child);
	    child = child->next;
	}
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child,
	    NULL, "(annotation?, (simpleContent | complexContent | "
	    "((group | all | choice | sequence)?, ((attribute | "
	    "attributeGroup)*, anyAttribute?))))");
    }
    /*
    * REDEFINE: SPEC src-redefine (5)
    */
    if (topLevel && ctxt->isRedefine && (! hasRestrictionOrExtension)) {
	xmlSchemaPCustomErr(ctxt, XML_SCHEMAP_SRC_REDEFINE,
	    NULL, node, "This is a redefinition, thus the "
	    "<complexType> must have a <restriction> or <extension> "
	    "grand-child", NULL);
    }
    ctxt->ctxtType = ctxtType;
    return (type);
}